

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge-swap-reduce.cpp
# Opt level: O1

void median_reduce(Block *b,ReduceProxy *rp,RegularMergePartners *param_3)

{
  uint uVar1;
  BlockID BVar2;
  pointer pPVar3;
  uint i_1;
  BlockID BVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  pointer pBVar7;
  mapped_type *pmVar8;
  Point<float,_3U> *pPVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  Point med;
  vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> medians;
  BlockID local_98;
  float local_90;
  Point<float,_3U> *local_88;
  iterator iStack_80;
  Point<float,_3U> *local_78;
  BlockID local_68;
  float local_60;
  ulong local_58;
  ulong local_48;
  Block *local_38;
  
  uVar10 = (ulong)rp->round_;
  local_88 = (Point<float,_3U> *)0x0;
  iStack_80._M_current = (Point<float,_3U> *)0x0;
  local_78 = (Point<float,_3U> *)0x0;
  local_38 = b;
  std::vector<diy::Point<float,3u>,std::allocator<diy::Point<float,3u>>>::
  _M_realloc_insert<diy::Point<float,3u>const&>
            ((vector<diy::Point<float,3u>,std::allocator<diy::Point<float,3u>>> *)&local_88,
             (iterator)0x0,
             (b->points).
             super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1);
  pBVar7 = (rp->in_link_).neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(rp->in_link_).neighbors_.
                              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pBVar7) >> 3)) {
    lVar13 = 0;
    do {
      BVar2 = pBVar7[lVar13];
      uVar1 = (rp->super_Proxy).gid_;
      BVar4.proc = 0;
      BVar4.gid = uVar1;
      uVar12 = BVar2.gid;
      if (uVar1 == uVar12) {
        format_str.size_ = 0x25;
        format_str.data_ = "[{}:{}] Skipping receiving from self\n";
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ =
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             &local_68;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = 0x21;
        local_68 = BVar4;
        local_58 = uVar10;
        fmt::v7::vprint(_stderr,format_str,args);
      }
      else {
        local_90 = 0.0;
        local_98.gid = 0;
        local_98.proc = 0;
        local_68.gid = uVar12;
        pmVar5 = Catch::clara::std::
                 map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                 ::operator[](&(rp->super_Proxy).incoming_,(key_type *)&local_68);
        (*(pmVar5->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar5,&local_98,0xc);
        local_48 = (ulong)BVar2 & 0xffffffff;
        local_68.proc = 0;
        local_68.gid = (rp->super_Proxy).gid_;
        format_str_00.size_ = 0x29;
        format_str_00.data_ = "[{}:{}] Received median values from [{}]\n";
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ =
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             &local_68;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = 0x121;
        local_58 = uVar10;
        fmt::v7::vprint(_stderr,format_str_00,args_00);
        if (iStack_80._M_current == local_78) {
          std::vector<diy::Point<float,3u>,std::allocator<diy::Point<float,3u>>>::
          _M_realloc_insert<diy::Point<float,3u>const&>
                    ((vector<diy::Point<float,3u>,std::allocator<diy::Point<float,3u>>> *)&local_88,
                     iStack_80,(Point<float,_3U> *)&local_98);
        }
        else {
          ((iStack_80._M_current)->super_array<float,_3UL>)._M_elems[2] = local_90;
          ((iStack_80._M_current)->super_array<float,_3UL>)._M_elems[0] = (float)local_98.gid;
          ((iStack_80._M_current)->super_array<float,_3UL>)._M_elems[1] = (float)local_98.proc;
          iStack_80._M_current = iStack_80._M_current + 1;
        }
      }
      lVar13 = lVar13 + 1;
      pBVar7 = (rp->in_link_).neighbors_.
               super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (lVar13 < (int)((ulong)((long)(rp->in_link_).neighbors_.
                                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar7)
                           >> 3));
  }
  uVar6 = ((long)iStack_80._M_current - (long)local_88 >> 2) * -0x5555555555555555;
  local_60 = 0.0;
  local_68.gid = 0;
  local_68.proc = 0;
  if (iStack_80._M_current != local_88) {
    lVar13 = 0;
    pPVar9 = local_88;
    do {
      lVar11 = 0;
      do {
        (&local_68.gid)[lVar11] =
             (int)((pPVar9->super_array<float,_3UL>)._M_elems[lVar11] +
                  (float)(&local_68.gid)[lVar11]);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      lVar13 = lVar13 + 1;
      pPVar9 = pPVar9 + 1;
    } while (lVar13 != uVar6 + (uVar6 == 0));
  }
  lVar13 = 0;
  do {
    (&local_68.gid)[lVar13] = (int)((float)(&local_68.gid)[lVar13] / (float)uVar6);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  local_98 = local_68;
  local_90 = local_60;
  pPVar3 = (local_38->points).
           super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pPVar3[-1].super_array<float,_3UL>._M_elems[2] = local_60;
  pPVar3[-1].super_array<float,_3UL>._M_elems[0] = (float)local_68.gid;
  pPVar3[-1].super_array<float,_3UL>._M_elems[1] = (float)local_68.proc;
  pBVar7 = (rp->out_link_).neighbors_.
           super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(rp->out_link_).neighbors_.
                              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pBVar7) >> 3)) {
    lVar13 = 0;
    do {
      uVar1 = (rp->super_Proxy).gid_;
      local_68.proc = 0;
      local_68.gid = uVar1;
      if (uVar1 == pBVar7[lVar13].gid) {
        format_str_01.size_ = 0x21;
        format_str_01.data_ = "[{}:{}] Skipping sending to self\n";
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ =
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             &local_68;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = 0x21;
        local_58 = uVar10;
        fmt::v7::vprint(_stderr,format_str_01,args_01);
      }
      else {
        local_68 = pBVar7[lVar13];
        pmVar8 = Catch::clara::std::
                 map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                 ::operator[](&(rp->super_Proxy).outgoing_,(key_type *)&local_68);
        (*(pmVar8->super_BinaryBuffer)._vptr_BinaryBuffer[2])(pmVar8,&local_98,0xc);
        local_68.proc = 0;
        local_68.gid = (rp->super_Proxy).gid_;
        local_48 = (ulong)(uint)(rp->out_link_).neighbors_.
                                super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar13].gid;
        format_str_02.size_ = 0x1c;
        format_str_02.data_ = "[{}:{}] Sent median to [{}]\n";
        args_02.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ =
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             &local_68;
        args_02.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = 0x121;
        local_58 = uVar10;
        fmt::v7::vprint(_stderr,format_str_02,args_02);
      }
      lVar13 = lVar13 + 1;
      pBVar7 = (rp->out_link_).neighbors_.
               super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (lVar13 < (int)((ulong)((long)(rp->out_link_).neighbors_.
                                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar7)
                           >> 3));
  }
  if (local_88 != (Point<float,_3U> *)0x0) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  return;
}

Assistant:

void median_reduce(Block* b,                                  // local block
                   const diy::ReduceProxy& rp,                // communication proxy
                   const diy::RegularMergePartners&)          // partners of the current block
{
    unsigned   round    = rp.round();               // current round number

    std::vector<Block::Point> medians;
    medians.push_back(b->points.back());

    // step 1: dequeue
    for (int i = 0; i < rp.in_link().size(); ++i)
    {
        int nbr_gid = rp.in_link().target(i).gid;
        if (nbr_gid == rp.gid())
        {
            fmt::print(stderr, "[{}:{}] Skipping receiving from self\n", rp.gid(), round);
            continue;
        }

        Block::Point med;
        rp.dequeue(nbr_gid, med);
        fmt::print(stderr, "[{}:{}] Received median values from [{}]\n",
                   rp.gid(), round, nbr_gid);
        medians.push_back(med);
    }

    // step 2 compute median
    Block::Point median = compute_median(medians);
    b->points.back() = median;

    // step 2: enqueue
    for (int i = 0; i < rp.out_link().size(); ++i)    // redundant since size should equal to 1
    {
        // only send to root of group, but not self
        if (rp.out_link().target(i).gid != rp.gid())
        {
            rp.enqueue(rp.out_link().target(i), median);
            fmt::print(stderr, "[{}:{}] Sent median to [{}]\n",
                       rp.gid(), round, rp.out_link().target(i).gid);
        } else {
            fmt::print(stderr, "[{}:{}] Skipping sending to self\n", rp.gid(), round);
        }
    }
}